

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::LiteralStringWithPropertyStringPtr::SetPropertyString
          (LiteralStringWithPropertyStringPtr *this,PropertyString *propStr)

{
  PropertyRecord *in_RAX;
  PropertyRecord *local_28;
  PropertyRecord *localPropertyRecord;
  
  local_28 = in_RAX;
  Memory::WriteBarrierPtr<Js::PropertyString>::WriteBarrierSet(&this->propertyString,propStr);
  if (propStr != (PropertyString *)0x0) {
    (*(propStr->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(propStr,&local_28,0);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
              (&this->propertyRecord,local_28);
  }
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::SetPropertyString(PropertyString * propStr)
    {
        this->propertyString = propStr;
        if (propStr != nullptr)
        {
            Js::PropertyRecord const * localPropertyRecord;
            propStr->GetPropertyRecord(&localPropertyRecord);
            this->propertyRecord = localPropertyRecord;
        }
    }